

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

double YPSpur_md_get_pos(YPSpur *spur,int cs,double *x,double *y,double *theta)

{
  int iVar1;
  double time;
  undefined1 auStack_70 [4];
  int len;
  YPSpur_msg msg;
  double *theta_local;
  double *y_local;
  double *x_local;
  int cs_local;
  YPSpur *spur_local;
  
  _auStack_70 = 1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x70;
  msg.pid._4_4_ = cs;
  msg.data[3] = (double)theta;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)auStack_70);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local = (YPSpur *)0xbff0000000000000;
  }
  else {
    iVar1 = (*(spur->dev).recv)(&spur->dev,(YPSpur_msg *)auStack_70);
    if (iVar1 < 0) {
      spur->connection_error = 1;
      spur_local = (YPSpur *)0xbff0000000000000;
    }
    else {
      *x = (double)msg._16_8_;
      *y = msg.data[0];
      *(double *)msg.data[3] = msg.data[1];
      spur_local = (YPSpur *)msg.data[2];
    }
  }
  return (double)spur_local;
}

Assistant:

double YPSpur_md_get_pos(YPSpur* spur, int cs, double* x, double* y, double* theta)
{
  YPSpur_msg msg;
  int len;
  double time;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_GET_POS;
  msg.cs = cs;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  *x = msg.data[0];
  *y = msg.data[1];
  *theta = msg.data[2];
  time = msg.data[3];
  return time;
}